

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O3

bool IsWellFormedPackage(Package *txns,PackageValidationState *state,bool require_sorted)

{
  CTransaction *tx;
  element_type *peVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  int iVar9;
  long in_FS_OFFSET;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  later_txids;
  string local_c0;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  __node_base local_80;
  size_type sStack_78;
  float local_70;
  size_t local_68;
  __node_base_ptr p_Stack_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar8 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (uint)((ulong)((long)psVar6 - (long)psVar8) >> 4);
  if (0x19 < uVar5) {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"package-too-many-transactions","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    bVar3 = ValidationState<PackageValidationResult>::Invalid
                      (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                       (string *)local_a0,&local_58);
LAB_002805db:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((TransactionSerParams *)local_a0._0_8_ != (TransactionSerParams *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
    }
    goto LAB_00280800;
  }
  if (psVar8 != psVar6) {
    iVar9 = 0;
    do {
      tx = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_a0._0_8_ = &TX_NO_WITNESS;
      local_a0._8_8_ = &local_58;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_a0,&TX_NO_WITNESS);
      iVar2 = (int)local_58._M_dataplus._M_p * 3;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_a0._0_8_ = &TX_WITH_WITNESS;
      local_a0._8_8_ = &local_58;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_a0,&TX_WITH_WITNESS)
      ;
      iVar9 = iVar9 + iVar2 + (int)local_58._M_dataplus._M_p;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar6);
    if ((1 < uVar5) && (0x62a20 < iVar9)) {
      local_a0._0_8_ = local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"package-too-large","");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      bVar3 = ValidationState<PackageValidationResult>::Invalid
                        (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                         (string *)local_a0,&local_58);
      goto LAB_002805db;
    }
  }
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)local_a0);
  local_90._M_allocated_capacity = (size_type)&p_Stack_60;
  local_90._8_8_ = 1;
  local_80._M_nxt = (_Hash_node_base *)0x0;
  sStack_78 = 0;
  local_70 = 1.0;
  local_68 = 0;
  p_Stack_60 = (__node_base_ptr)0x0;
  psVar6 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  psVar7 = psVar6;
  if (psVar6 != psVar8) {
    do {
      peVar1 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58._M_dataplus._M_p =
           *(pointer *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_58._M_string_length._0_4_ =
           *(undefined4 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
      ;
      local_58._M_string_length._4_4_ =
           *(undefined4 *)
            ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
      local_58.field_2._M_allocated_capacity._0_4_ =
           *(undefined4 *)
            ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_58.field_2._M_allocated_capacity._4_4_ =
           *(undefined4 *)
            ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
      local_58.field_2._8_4_ =
           *(undefined4 *)
            ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_58.field_2._12_4_ =
           *(undefined4 *)
            ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
      local_c0._M_dataplus._M_p = (pointer)local_a0;
      std::
      _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_a0,&local_58,&local_c0);
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar8);
    psVar6 = (txns->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    psVar7 = (txns->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  if (sStack_78 == (long)psVar6 - (long)psVar7 >> 4) {
    if ((require_sorted) &&
       (bVar3 = IsTopoSortedPackage(txns,(unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                                          *)local_a0), !bVar3)) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"package-not-sorted","");
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
      bVar3 = ValidationState<PackageValidationResult>::Invalid
                        (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                         &local_58,&local_c0);
      goto LAB_002807c0;
    }
    bVar4 = IsConsistentPackage(txns);
    bVar3 = true;
    if (!bVar4) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"conflict-in-package","");
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
      bVar3 = ValidationState<PackageValidationResult>::Invalid
                        (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                         &local_58,&local_c0);
      goto LAB_002807c0;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"package-contains-duplicates","");
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    bVar3 = ValidationState<PackageValidationResult>::Invalid
                      (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,&local_58,
                       &local_c0);
LAB_002807c0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_a0);
LAB_00280800:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool IsWellFormedPackage(const Package& txns, PackageValidationState& state, bool require_sorted)
{
    const unsigned int package_count = txns.size();

    if (package_count > MAX_PACKAGE_COUNT) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-too-many-transactions");
    }

    const int64_t total_weight = std::accumulate(txns.cbegin(), txns.cend(), 0,
                               [](int64_t sum, const auto& tx) { return sum + GetTransactionWeight(*tx); });
    // If the package only contains 1 tx, it's better to report the policy violation on individual tx weight.
    if (package_count > 1 && total_weight > MAX_PACKAGE_WEIGHT) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-too-large");
    }

    std::unordered_set<uint256, SaltedTxidHasher> later_txids;
    std::transform(txns.cbegin(), txns.cend(), std::inserter(later_txids, later_txids.end()),
                   [](const auto& tx) { return tx->GetHash(); });

    // Package must not contain any duplicate transactions, which is checked by txid. This also
    // includes transactions with duplicate wtxids and same-txid-different-witness transactions.
    if (later_txids.size() != txns.size()) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-contains-duplicates");
    }

    // Require the package to be sorted in order of dependency, i.e. parents appear before children.
    // An unsorted package will fail anyway on missing-inputs, but it's better to quit earlier and
    // fail on something less ambiguous (missing-inputs could also be an orphan or trying to
    // spend nonexistent coins).
    if (require_sorted && !IsTopoSortedPackage(txns, later_txids)) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-not-sorted");
    }

    // Don't allow any conflicting transactions, i.e. spending the same inputs, in a package.
    if (!IsConsistentPackage(txns)) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "conflict-in-package");
    }
    return true;
}